

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  Error EVar1;
  ulong uVar2;
  uint32_t uVar3;
  char *str;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  uVar4 = (op->field_0)._any.signature;
  switch(uVar4 & 7) {
  case 1:
    EVar1 = X86Logging::formatRegister
                      (sb,logOptions,emitter,0x13e7a0,uVar4 >> 3 & 0x1f,(op->field_0)._any.id);
    return EVar1;
  case 2:
    break;
  case 3:
    uVar6 = *(ulong *)((long)&op->field_0 + 8);
    if (uVar6 < 10 || (logOptions & 4) == 0) {
      uVar3 = 10;
      uVar5 = 0x80000000;
    }
    else {
      uVar3 = 0x10;
      uVar5 = 0;
    }
    EVar1 = StringBuilder::_opNumber(sb,1,uVar6,uVar3,0,uVar5);
    return EVar1;
  case 4:
    EVar1 = formatLabel(sb,logOptions,emitter,(op->field_0)._any.id);
    return EVar1;
  default:
    EVar1 = StringBuilder::_opString(sb,1,"<None>",0xffffffffffffffff);
    return EVar1;
  }
  uVar4 = uVar4 >> 0x18;
  switch(uVar4) {
  case 1:
    str = "byte ";
    break;
  case 2:
    str = "word ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_00123b78_caseD_3:
    str = "";
    break;
  case 4:
    str = "dword ";
    break;
  case 6:
    str = "fword ";
    break;
  case 8:
    str = "qword ";
    break;
  case 10:
    str = "tword ";
    break;
  case 0x10:
    str = "oword ";
    break;
  default:
    if (uVar4 == 0x20) {
      str = "yword ";
    }
    else {
      if (uVar4 != 0x40) goto switchD_00123b78_caseD_3;
      str = "zword ";
    }
  }
  EVar1 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
  if (EVar1 == 0) {
    uVar4 = (op->field_0)._any.signature >> 0x12 & 7;
    uVar3 = uVar4 - 1;
    if (uVar3 < 6) {
      uVar3 = 0x13e990;
      EVar1 = StringBuilder::appendFormat(sb,"%s:",(ulong)uVar4 * 4 + 0x13ea70);
      if (EVar1 != 0) {
        return EVar1;
      }
    }
    uVar5 = 1;
    EVar1 = StringBuilder::_opChar(sb,1,'[');
    if (EVar1 == 0) {
      uVar4 = (op->field_0)._any.signature;
      if ((uVar4 >> 0xd & 1) != 0) {
        uVar5 = 1;
        uVar3 = 0xffffffff;
        EVar1 = StringBuilder::_opString(sb,1,"abs ",0xffffffffffffffff);
        if (EVar1 != 0) {
          return EVar1;
        }
        uVar4 = (op->field_0)._any.signature;
      }
      if ((uVar4 & 0xf8) != 0) {
        if ((uVar4 & 0xf8) == 8) {
          EVar1 = formatLabel(sb,logOptions,emitter,(op->field_0)._any.reserved12_4);
        }
        else {
          if ((uVar4 >> 0xe & 1) != 0) {
            uVar5 = 1;
            uVar3 = 0xffffffff;
            EVar1 = StringBuilder::_opString(sb,1,"$",0xffffffffffffffff);
            if (EVar1 != 0) {
              return EVar1;
            }
            uVar4 = (op->field_0)._any.signature;
          }
          if ((short)uVar4 < 0) {
            uVar5 = 1;
            uVar3 = 0xffffffff;
            EVar1 = StringBuilder::_opString(sb,1,"&",0xffffffffffffffff);
            if (EVar1 != 0) {
              return EVar1;
            }
            uVar4 = (op->field_0)._any.signature;
          }
          EVar1 = X86Logging::formatRegister
                            (sb,uVar5,emitter,uVar3,uVar4 >> 3 & 0x1f,
                             (op->field_0)._any.reserved12_4);
        }
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      uVar4 = (op->field_0)._any.signature;
      if ((uVar4 & 0x1f00) != 0) {
        uVar3 = 1;
        EVar1 = StringBuilder::_opChar(sb,1,'+');
        if (EVar1 != 0) {
          return EVar1;
        }
        EVar1 = X86Logging::formatRegister
                          (sb,uVar3,emitter,uVar4,(op->field_0)._any.signature >> 8 & 0x1f,
                           (op->field_0)._any.id);
        if (EVar1 != 0) {
          return EVar1;
        }
        uVar4 = (op->field_0)._any.signature;
        if ((uVar4 & 0x30000) != 0) {
          EVar1 = StringBuilder::appendFormat
                            (sb,"*%u",(ulong)(uint)(1 << ((byte)(uVar4 >> 0x10) & 3)));
          if (EVar1 != 0) {
            return EVar1;
          }
          uVar4 = (op->field_0)._any.signature;
        }
      }
      uVar6 = *(ulong *)((long)&op->field_0 + 8);
      uVar2 = (long)(int)uVar6;
      if ((uVar4 & 0xf8) == 0) {
        uVar2 = uVar6;
      }
      if (uVar2 == 0) {
LAB_00123e6f:
        EVar1 = StringBuilder::_opChar(sb,1,']');
        return EVar1;
      }
      uVar6 = -uVar2;
      if (0 < (long)uVar2) {
        uVar6 = uVar2;
      }
      EVar1 = StringBuilder::_opChar(sb,1,(char)((long)uVar2 >> 0x3f) * -2 + '+');
      if (EVar1 == 0) {
        uVar3 = 10;
        if (((logOptions & 8) != 0) && (9 < uVar6)) {
          EVar1 = StringBuilder::_opString(sb,1,"0x",2);
          if (EVar1 != 0) {
            return EVar1;
          }
          uVar3 = 0x10;
        }
        EVar1 = StringBuilder::_opNumber(sb,1,uVar6,uVar3,0,0);
        if (EVar1 == 0) goto LAB_00123e6f;
      }
    }
  }
  return EVar1;
}

Assistant:

Error Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}